

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flash.h
# Opt level: O0

void __thiscall Flash::~Flash(Flash *this)

{
  Flash *this_local;
  
  this->_vptr_Flash = (_func_int **)&PTR__Flash_001280e0;
  FlashOption<bool>::~FlashOption(&this->_security);
  FlashOption<bool>::~FlashOption(&this->_bor);
  FlashOption<bool>::~FlashOption(&this->_bod);
  FlashOption<std::vector<bool,_std::allocator<bool>_>_>::~FlashOption(&this->_regions);
  FlashOption<bool>::~FlashOption(&this->_bootFlash);
  WordCopyApplet::~WordCopyApplet(&this->_wordCopy);
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

virtual ~Flash() {}